

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2e8cd18::PeerManagerImpl::ProcessHeadersMessage
          (PeerManagerImpl *this,CNode *pfrom,Peer *peer,
          vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers,bool via_compact_block)

{
  _Rb_tree_header *p_Var1;
  uchar *puVar2;
  uint uVar3;
  long lVar4;
  pointer pCVar5;
  pointer ppCVar6;
  NodeId NVar7;
  uint256 *puVar8;
  undefined1 auVar9 [16];
  base_blob<256U> *pbVar10;
  mutex_type *pmVar11;
  bool bVar12;
  int i;
  int iVar13;
  uchar *puVar14;
  CBlockIndex *pCVar15;
  CBlockIndex *pCVar16;
  CBlockIndex *pCVar17;
  Chainstate *pCVar18;
  long lVar19;
  Logger *pLVar20;
  _Base_ptr p_Var21;
  int64_t iVar22;
  optional<arith_uint256> *b;
  size_type sVar23;
  HeadersSyncState *pHVar24;
  ulong uVar25;
  _Base_ptr p_Var26;
  string *message;
  string *message_00;
  const_iterator __end1;
  undefined8 uVar27;
  ChainstateManager *pCVar28;
  _Alloc_hider _Var29;
  pointer pCVar30;
  long lVar31;
  undefined8 *puVar32;
  mutex_type *pmVar33;
  const_iterator __begin1;
  pointer pCVar34;
  _Base_ptr *pp_Var35;
  long in_FS_OFFSET;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  span<const_CBlockHeader,_18446744073709551615UL> headers_00;
  span<const_CBlockHeader,_18446744073709551615UL> headers_01;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  pair<std::_Rb_tree_iterator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
  pVar39;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  CBlockIndex *pindexLast;
  NodeId local_130;
  vector<CInv,_std::allocator<CInv>_> vGetData;
  CBlockIndex *local_110;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock64;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock65;
  BlockValidationState state;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock68;
  undefined1 local_78 [32];
  arith_uint256 minimum_chain_work;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  lVar31 = (long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar31 == 0) {
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p._0_1_ = 0;
    state.super_ValidationState<BlockValidationResult>._0_8_ = &peer->m_headers_sync_mutex;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&state);
    if ((peer->m_headers_sync)._M_t.
        super___uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>._M_t.
        super__Tuple_impl<0UL,_HeadersSyncState_*,_std::default_delete<HeadersSyncState>_>.
        super__Head_base<0UL,_HeadersSyncState_*,_false>._M_head_impl != (HeadersSyncState *)0x0) {
      std::__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::reset
                ((__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
                 &peer->m_headers_sync,(pointer)0x0);
      criticalblock68.super_unique_lock._M_device = &(this->m_headers_presync_mutex).super_mutex;
      criticalblock68.super_unique_lock._8_8_ =
           criticalblock68.super_unique_lock._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::mutex>::lock(&criticalblock68.super_unique_lock);
      minimum_chain_work.super_base_uint<256U>.pn._0_8_ = pfrom->id;
      pVar39 = std::
               _Rb_tree<long,_std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
               ::equal_range(&(this->m_headers_presync_stats)._M_t,
                             (key_type_conflict4 *)&minimum_chain_work);
      std::
      _Rb_tree<long,_std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
      ::_M_erase_aux(&(this->m_headers_presync_stats)._M_t,(_Base_ptr)pVar39.first._M_node,
                     (_Base_ptr)pVar39.second._M_node);
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock68.super_unique_lock);
    }
    (peer->m_last_getheaders_timestamp).__d.__r = 0;
LAB_008f0af4:
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&state);
    goto LAB_008f0b8f;
  }
  bVar12 = HasValidProofOfWork(headers,&this->m_chainparams->consensus);
  if (bVar12) {
    pCVar34 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pCVar5 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._8_16_ =
         (undefined1  [16])0x0;
    state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
    state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)0x0;
    auVar37 = (undefined1  [16])state.super_ValidationState<BlockValidationResult>._0_16_;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)0x0;
    if (pCVar34 != pCVar5) {
      puVar2 = (uchar *)((long)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                                field_2 + 8);
      do {
        state.super_ValidationState<BlockValidationResult>._0_16_ = auVar37;
        puVar14 = std::
                  __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                            (&state,puVar2);
        if (puVar14 != puVar2) {
          auVar38[0] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x10] ==
                        (uchar)state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                               _M_string_length);
          auVar38[1] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x11] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_string_length._1_1_);
          auVar38[2] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x12] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_string_length._2_1_);
          auVar38[3] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x13] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_string_length._3_1_);
          auVar38[4] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x14] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_string_length._4_1_);
          auVar38[5] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x15] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_string_length._5_1_);
          auVar38[6] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x16] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_string_length._6_1_);
          auVar38[7] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x17] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_string_length._7_1_);
          auVar38[8] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x18] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
                        _M_local_buf[0]);
          auVar38[9] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x19] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
                        _M_local_buf[1]);
          auVar38[10] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                         state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
                         _M_local_buf[2]);
          auVar38[0xb] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2
                          ._M_local_buf[3]);
          auVar38[0xc] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2
                          ._M_local_buf[4]);
          auVar38[0xd] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2
                          ._M_local_buf[5]);
          auVar38[0xe] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2
                          ._M_local_buf[6]);
          auVar38[0xf] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2
                          ._M_local_buf[7]);
          auVar37[0] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0] ==
                        (undefined1)state.super_ValidationState<BlockValidationResult>.m_mode);
          auVar37[1] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1] ==
                        state.super_ValidationState<BlockValidationResult>.m_mode._1_1_);
          auVar37[2] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2] ==
                        state.super_ValidationState<BlockValidationResult>.m_mode._2_1_);
          auVar37[3] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3] ==
                        state.super_ValidationState<BlockValidationResult>.m_mode._3_1_);
          auVar37[4] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[4] ==
                        (undefined1)state.super_ValidationState<BlockValidationResult>.m_result);
          auVar37[5] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[5] ==
                        state.super_ValidationState<BlockValidationResult>.m_result._1_1_);
          auVar37[6] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[6] ==
                        state.super_ValidationState<BlockValidationResult>.m_result._2_1_);
          auVar37[7] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[7] ==
                        state.super_ValidationState<BlockValidationResult>.m_result._3_1_);
          auVar37[8] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[8] ==
                        (uchar)state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                               _M_dataplus._M_p);
          auVar37[9] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[9] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_dataplus._M_p._1_1_);
          auVar37[10] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[10] ==
                         state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                         _M_dataplus._M_p._2_1_);
          auVar37[0xb] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xb] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                          _M_dataplus._M_p._3_1_);
          auVar37[0xc] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xc] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                          _M_dataplus._M_p._4_1_);
          auVar37[0xd] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xd] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                          _M_dataplus._M_p._5_1_);
          auVar37[0xe] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xe] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                          _M_dataplus._M_p._6_1_);
          auVar37[0xf] = -((pCVar34->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xf] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                          _M_dataplus._M_p._7_1_);
          auVar37 = auVar37 & auVar38;
          if ((ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar37[0xf] >> 7) << 0xf) != 0xffff) {
            criticalblock68.super_unique_lock._M_device = (mutex_type *)0x1f;
            state.super_ValidationState<BlockValidationResult>._0_8_ =
                 &state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                  _M_string_length;
            state.super_ValidationState<BlockValidationResult>._0_8_ =
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &state,(size_type *)&criticalblock68,0);
            state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
                 (size_type)criticalblock68.super_unique_lock._M_device;
            builtin_strncpy((char *)state.super_ValidationState<BlockValidationResult>._0_8_,
                            "non-continuous headers sequence",0x1f);
            state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
                 (pointer)criticalblock68.super_unique_lock._M_device;
            *(char *)(state.super_ValidationState<BlockValidationResult>._0_8_ +
                     (long)criticalblock68.super_unique_lock._M_device) = '\0';
            Misbehaving((PeerManagerImpl *)peer,(Peer *)&state,message_00);
            goto LAB_008f0b72;
          }
        }
        CBlockHeader::GetHash((uint256 *)&criticalblock68,pCVar34);
        state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = local_78._8_8_;
        state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
             local_78._0_8_;
        state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)criticalblock68.super_unique_lock._8_8_;
        state.super_ValidationState<BlockValidationResult>._0_8_ =
             criticalblock68.super_unique_lock._M_device;
        auVar37 = (undefined1  [16])state.super_ValidationState<BlockValidationResult>._0_16_;
        pCVar34 = pCVar34 + 1;
      } while (pCVar34 != pCVar5);
    }
    pindexLast = (CBlockIndex *)0x0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p._0_1_ = 0;
    state.super_ValidationState<BlockValidationResult>._0_8_ = &peer->m_headers_sync_mutex;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&state);
    bVar12 = IsContinuationOfLowWorkHeadersSync(this,peer,pfrom,headers);
    if ((headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_008f0af4;
    pHVar24 = (peer->m_headers_sync)._M_t.
              super___uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>._M_t.
              super__Tuple_impl<0UL,_HeadersSyncState_*,_std::default_delete<HeadersSyncState>_>.
              super__Head_base<0UL,_HeadersSyncState_*,_false>._M_head_impl;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&state);
    state.super_ValidationState<BlockValidationResult>._0_9_ = ZEXT89(0x139c540);
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&state);
    pCVar15 = ::node::BlockManager::LookupBlockIndex
                        (&this->m_chainman->m_blockman,
                         &((headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>
                           )._M_impl.super__Vector_impl_data._M_start)->hashPrevBlock);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&state);
    if (pCVar15 == (CBlockIndex *)0x0) {
      state.super_ValidationState<BlockValidationResult>._0_9_ = ZEXT89(0x139c540);
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&state);
      pCVar15 = this->m_chainman->m_best_header;
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&state);
      GetLocator((CBlockLocator *)&state,pCVar15);
      bVar12 = MaybeSendGetHeaders(this,pfrom,(CBlockLocator *)&state,peer);
      if (state.super_ValidationState<BlockValidationResult>._0_8_ != 0) {
        operator_delete((void *)state.super_ValidationState<BlockValidationResult>._0_8_,
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_string_length - state.super_ValidationState<BlockValidationResult>._0_8_)
        ;
      }
      if (bVar12) {
        pLVar20 = LogInstance();
        bVar12 = BCLog::Logger::WillLogCategoryLevel(pLVar20,NET,Debug);
        if (bVar12) {
          CBlockHeader::GetHash
                    ((uint256 *)&criticalblock68,
                     (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                     _M_impl.super__Vector_impl_data._M_start);
          base_blob<256u>::ToString_abi_cxx11_((string *)&state,(uint256 *)&criticalblock68);
          base_blob<256u>::ToString_abi_cxx11_
                    ((string *)&minimum_chain_work,
                     &((headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                       _M_impl.super__Vector_impl_data._M_start)->hashPrevBlock);
          criticalblock64.super_unique_lock._M_device = (mutex_type *)pfrom->id;
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
          ;
          source_file._M_len = 0x62;
          logging_function._M_str = "HandleUnconnectingHeaders";
          logging_function._M_len = 0x19;
          LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,int,long>
                    (logging_function,source_file,0xac4,NET,Debug,
                     (ConstevalFormatString<4U>)0xf7cd94,(string *)&state,
                     (string *)&minimum_chain_work,&pCVar15->nHeight,(long *)&criticalblock64);
          if ((uint32_t *)minimum_chain_work.super_base_uint<256U>.pn._0_8_ !=
              minimum_chain_work.super_base_uint<256U>.pn + 4) {
            operator_delete((void *)minimum_chain_work.super_base_uint<256U>.pn._0_8_,
                            minimum_chain_work.super_base_uint<256U>.pn._16_8_ + 1);
          }
          if ((size_type *)state.super_ValidationState<BlockValidationResult>._0_8_ !=
              &state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length)
          {
            operator_delete((void *)state.super_ValidationState<BlockValidationResult>._0_8_,
                            state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                            _M_string_length + 1);
          }
        }
      }
      criticalblock68.super_unique_lock._M_device = (mutex_type *)&cs_main;
      criticalblock68.super_unique_lock._8_8_ =
           criticalblock68.super_unique_lock._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock
                ((unique_lock<std::recursive_mutex> *)&criticalblock68);
      NVar7 = pfrom->id;
      CBlockHeader::GetHash
                ((uint256 *)&state,
                 (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                 super__Vector_impl_data._M_finish + -1);
      UpdateBlockAvailability(this,NVar7,(uint256 *)&state);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&criticalblock68);
      goto LAB_008f0b8f;
    }
    (peer->m_last_getheaders_timestamp).__d.__r = 0;
    criticalblock68.super_unique_lock._M_device = (mutex_type *)&cs_main;
    criticalblock68.super_unique_lock._8_8_ =
         criticalblock68.super_unique_lock._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::recursive_mutex>::lock
              ((unique_lock<std::recursive_mutex> *)&criticalblock68);
    pCVar28 = this->m_chainman;
    CBlockHeader::GetHash
              ((uint256 *)&state,
               (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
               super__Vector_impl_data._M_finish + -1);
    pCVar16 = ::node::BlockManager::LookupBlockIndex(&pCVar28->m_blockman,(uint256 *)&state);
    if (pCVar16 == (CBlockIndex *)0x0) {
      bVar36 = false;
    }
    else {
      pCVar28 = this->m_chainman;
      if (pCVar28->m_best_header != (CBlockIndex *)0x0) {
        pCVar17 = CBlockIndex::GetAncestor(pCVar28->m_best_header,pCVar16->nHeight);
        if (pCVar17 == pCVar16) {
          bVar36 = true;
          goto LAB_008f0e18;
        }
        pCVar28 = this->m_chainman;
      }
      pCVar18 = ChainstateManager::ActiveChainstate(pCVar28);
      iVar13 = pCVar16->nHeight;
      if (((long)iVar13 < 0) ||
         (ppCVar6 = (pCVar18->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
         (int)((ulong)((long)(pCVar18->m_chain).vChain.
                             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6) >> 3) <=
         iVar13)) {
        pCVar17 = (CBlockIndex *)0x0;
      }
      else {
        pCVar17 = ppCVar6[iVar13];
      }
      bVar36 = pCVar17 == pCVar16;
    }
LAB_008f0e18:
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&criticalblock68);
    if ((!bVar12 && !bVar36) && ((pfrom->m_permission_flags & NoBan) != NoBan)) {
      pCVar34 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                super__Vector_impl_data._M_start;
      headers_00._M_extent._M_extent_value =
           ((long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl
                  .super__Vector_impl_data._M_finish - (long)pCVar34 >> 4) * -0x3333333333333333;
      headers_00._M_ptr = pCVar34;
      CalculateClaimedHeadersWork(&minimum_chain_work,headers_00);
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._8_16_ =
           *(undefined1 (*) [16])((pCVar15->nChainWork).super_base_uint<256U>.pn + 4);
      state.super_ValidationState<BlockValidationResult>._0_16_ =
           *(undefined1 (*) [16])(pCVar15->nChainWork).super_base_uint<256U>.pn;
      lVar19 = 0;
      uVar25 = 0;
      do {
        uVar25 = (ulong)minimum_chain_work.super_base_uint<256U>.pn[lVar19] +
                 (&state.super_ValidationState<BlockValidationResult>.m_mode)[lVar19] + uVar25;
        (&state.super_ValidationState<BlockValidationResult>.m_mode)[lVar19] = (ModeState)uVar25;
        uVar25 = uVar25 >> 0x20;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 8);
      local_78._0_8_ =
           state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length;
      local_78._8_8_ =
           state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
           _M_allocated_capacity;
      criticalblock68.super_unique_lock._M_device =
           (mutex_type *)state.super_ValidationState<BlockValidationResult>._0_8_;
      criticalblock68.super_unique_lock._8_8_ =
           state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p;
      GetAntiDoSWorkThreshold((arith_uint256 *)&minimum_chain_work.super_base_uint<256U>,this);
      iVar13 = base_uint<256U>::CompareTo
                         ((base_uint<256U> *)&criticalblock68,
                          &minimum_chain_work.super_base_uint<256U>);
      if (iVar13 < 0) {
        if (((long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333 -
            (ulong)(this->m_opts).max_headers_result == 0) {
          criticalblock64.super_unique_lock._M_owns = false;
          criticalblock64.super_unique_lock._M_device = &(peer->m_headers_sync_mutex).super_mutex;
          std::unique_lock<std::mutex>::lock(&criticalblock64.super_unique_lock);
          pHVar24 = (HeadersSyncState *)operator_new(0x1e8);
          HeadersSyncState::HeadersSyncState
                    (pHVar24,peer->m_id,&this->m_chainparams->consensus,pCVar15,&minimum_chain_work)
          ;
          std::__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::reset
                    ((__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
                     &peer->m_headers_sync,pHVar24);
          IsContinuationOfLowWorkHeadersSync(this,peer,pfrom,headers);
          std::unique_lock<std::mutex>::~unique_lock(&criticalblock64.super_unique_lock);
        }
        else {
          pLVar20 = LogInstance();
          bVar12 = BCLog::Logger::WillLogCategoryLevel(pLVar20,NET,Debug);
          if (bVar12) {
            criticalblock64.super_unique_lock._M_device =
                 (mutex_type *)
                 (((long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333 +
                 (long)pCVar15->nHeight);
            vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data
            ._M_start = (pointer)pfrom->id;
            source_file_03._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
            ;
            source_file_03._M_len = 0x62;
            logging_function_03._M_str = "TryLowWorkHeadersSync";
            logging_function_03._M_len = 0x15;
            LogPrintFormatInternal<unsigned_long,long>
                      (logging_function_03,source_file_03,0xb4d,NET,Debug,
                       (ConstevalFormatString<2U>)0xf7cdff,(unsigned_long *)&criticalblock64,
                       (long *)&vGetData);
          }
        }
        std::vector<CBlockHeader,std::allocator<CBlockHeader>>::_M_assign_aux<CBlockHeader_const*>
                  ((vector<CBlockHeader,std::allocator<CBlockHeader>> *)headers,0,0);
        goto LAB_008f0b8f;
      }
    }
    auVar9._8_8_ = 0;
    auVar9._0_8_ = &state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
    state.super_ValidationState<BlockValidationResult>._0_16_ = auVar9 << 0x40;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._8_9_ = ZEXT89(0);
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
         '\0';
    pCVar34 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
              super__Vector_impl_data._M_start;
    headers_01._M_extent._M_extent_value =
         ((long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pCVar34 >> 4) * -0x3333333333333333;
    headers_01._M_ptr = pCVar34;
    bVar12 = ChainstateManager::ProcessNewBlockHeaders
                       (this->m_chainman,headers_01,true,&state,&pindexLast);
    if (bVar12 || state.super_ValidationState<BlockValidationResult>.m_mode != M_INVALID) {
      if (pindexLast == (CBlockIndex *)0x0) {
        __assert_fail("pindexLast",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                      ,0xc6f,
                      "void (anonymous namespace)::PeerManagerImpl::ProcessHeadersMessage(CNode &, Peer &, std::vector<CBlockHeader> &&, bool)"
                     );
      }
      lVar31 = (lVar31 >> 4) * -0x3333333333333333;
      if ((pHVar24 == (HeadersSyncState *)0x0) &&
         (lVar31 - (ulong)(this->m_opts).max_headers_result == 0)) {
        GetLocator((CBlockLocator *)&criticalblock68,pindexLast);
        bVar12 = MaybeSendGetHeaders(this,pfrom,(CBlockLocator *)&criticalblock68,peer);
        if (criticalblock68.super_unique_lock._M_device != (mutex_type *)0x0) {
          operator_delete(criticalblock68.super_unique_lock._M_device,
                          local_78._0_8_ - (long)criticalblock68.super_unique_lock._M_device);
        }
        if (bVar12) {
          pLVar20 = LogInstance();
          bVar12 = BCLog::Logger::WillLogCategoryLevel(pLVar20,NET,Debug);
          if (bVar12) {
            criticalblock68.super_unique_lock._M_device = (mutex_type *)pfrom->id;
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
            ;
            source_file_00._M_len = 0x62;
            logging_function_00._M_str = "ProcessHeadersMessage";
            logging_function_00._M_len = 0x15;
            LogPrintFormatInternal<int,long,std::atomic<int>>
                      (logging_function_00,source_file_00,0xc76,NET,Debug,
                       (ConstevalFormatString<3U>)0xf7ccb6,&pindexLast->nHeight,
                       (long *)&criticalblock68,&peer->m_starting_height);
          }
        }
      }
      pCVar15 = pindexLast;
      uVar3 = (this->m_opts).max_headers_result;
      minimum_chain_work.super_base_uint<256U>.pn._0_8_ = &cs_main;
      minimum_chain_work.super_base_uint<256U>.pn._8_8_ =
           minimum_chain_work.super_base_uint<256U>.pn._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock
                ((unique_lock<std::recursive_mutex> *)&minimum_chain_work);
      NVar7 = pfrom->id;
      p_Var26 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
      p_Var21 = &p_Var1->_M_header;
      if (p_Var26 == (_Base_ptr)0x0) {
LAB_008f1177:
        pp_Var35 = (_Base_ptr *)0x0;
      }
      else {
        do {
          if (NVar7 <= *(long *)(p_Var26 + 1)) {
            p_Var21 = p_Var26;
          }
          p_Var26 = (&p_Var26->_M_left)[*(long *)(p_Var26 + 1) < NVar7];
        } while (p_Var26 != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var21 == p_Var1) goto LAB_008f1177;
        pp_Var35 = (_Base_ptr *)0x0;
        if (*(long *)(p_Var21 + 1) <= NVar7) {
          pp_Var35 = &p_Var21[1]._M_parent;
        }
      }
      puVar8 = pCVar15->phashBlock;
      if (puVar8 == (uint256 *)0x0) goto LAB_008f1c29;
      criticalblock68.super_unique_lock._M_device =
           *(mutex_type **)(puVar8->super_base_blob<256U>).m_data._M_elems;
      pbVar10 = &puVar8->super_base_blob<256U>;
      criticalblock68.super_unique_lock._M_owns = (bool)(pbVar10->m_data)._M_elems[8];
      criticalblock68.super_unique_lock._9_1_ = (pbVar10->m_data)._M_elems[9];
      criticalblock68.super_unique_lock._10_1_ = (pbVar10->m_data)._M_elems[10];
      criticalblock68.super_unique_lock._11_1_ = (pbVar10->m_data)._M_elems[0xb];
      criticalblock68.super_unique_lock._12_1_ = (pbVar10->m_data)._M_elems[0xc];
      criticalblock68.super_unique_lock._13_1_ = (pbVar10->m_data)._M_elems[0xd];
      criticalblock68.super_unique_lock._14_1_ = (pbVar10->m_data)._M_elems[0xe];
      criticalblock68.super_unique_lock._15_1_ = (pbVar10->m_data)._M_elems[0xf];
      local_78._0_8_ = *(undefined8 *)((puVar8->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_78._8_8_ = *(undefined8 *)((puVar8->super_base_blob<256U>).m_data._M_elems + 0x18);
      UpdateBlockAvailability(this,NVar7,(uint256 *)&criticalblock68);
      if (pCVar16 == (CBlockIndex *)0x0) {
        pCVar18 = ChainstateManager::ActiveChainstate(this->m_chainman);
        iVar13 = base_uint<256U>::CompareTo
                           (&(pCVar15->nChainWork).super_base_uint<256U>,
                            &((pCVar18->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish[-1]->nChainWork).
                             super_base_uint<256U>);
        if (0 < iVar13) {
          iVar22 = GetTime();
          pp_Var35[0x11] = (_Base_ptr)iVar22;
        }
      }
      bVar12 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
      if ((bVar12 && lVar31 - (ulong)uVar3 != 0) && (p_Var26 = *pp_Var35, p_Var26 != (_Base_ptr)0x0)
         ) {
        b = inline_assertion_check<true,std::optional<arith_uint256>const&>
                      (&(this->m_chainman->m_options).minimum_chain_work,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.h"
                       ,0x3d3,"MinimumChainWork","m_options.minimum_chain_work");
        iVar13 = base_uint<256U>::CompareTo
                           ((base_uint<256U> *)&p_Var26[1]._M_parent,(base_uint<256U> *)b);
        if (iVar13 < 0) {
          if (ADDR_FETCH < pfrom->m_conn_type) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.h"
                          ,0x301,"bool CNode::IsOutboundOrBlockRelayConn() const");
          }
          if ((0x2dU >> (pfrom->m_conn_type & 0x1f) & 1) == 0) {
            criticalblock68.super_unique_lock._M_device = (mutex_type *)pfrom->id;
            source_file_01._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
            ;
            source_file_01._M_len = 0x62;
            logging_function_01._M_str = "UpdatePeerStateForReceivedHeaders";
            logging_function_01._M_len = 0x21;
            LogPrintFormatInternal<long>
                      (logging_function_01,source_file_01,0xbd8,ALL,Info,
                       (ConstevalFormatString<1U>)0xf7ce53,(long *)&criticalblock68);
            LOCK();
            (pfrom->fDisconnect)._M_base._M_i = true;
            UNLOCK();
          }
        }
      }
      if ((((((pfrom->fDisconnect)._M_base._M_i & 1U) == 0) &&
           (pfrom->m_conn_type == OUTBOUND_FULL_RELAY)) &&
          (p_Var26 = *pp_Var35, p_Var26 != (_Base_ptr)0x0)) &&
         (this->m_outbound_peers_with_protect_from_disconnect < 4)) {
        pCVar18 = ChainstateManager::ActiveChainstate(this->m_chainman);
        iVar13 = base_uint<256U>::CompareTo
                           ((base_uint<256U> *)&p_Var26[1]._M_parent,
                            &((pCVar18->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish[-1]->nChainWork).
                             super_base_uint<256U>);
        if ((-1 < iVar13) && (*(char *)((long)pp_Var35 + 0x81) == '\0')) {
          pLVar20 = LogInstance();
          bVar12 = BCLog::Logger::WillLogCategoryLevel(pLVar20,NET,Debug);
          if (bVar12) {
            criticalblock68.super_unique_lock._M_device = (mutex_type *)pfrom->id;
            source_file_02._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
            ;
            source_file_02._M_len = 0x62;
            logging_function_02._M_str = "UpdatePeerStateForReceivedHeaders";
            logging_function_02._M_len = 0x21;
            LogPrintFormatInternal<long>
                      (logging_function_02,source_file_02,0xbe5,NET,Debug,
                       (ConstevalFormatString<1U>)0xf7ce9a,(long *)&criticalblock68);
          }
          *(undefined1 *)((long)pp_Var35 + 0x81) = 1;
          this->m_outbound_peers_with_protect_from_disconnect =
               this->m_outbound_peers_with_protect_from_disconnect + 1;
        }
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&minimum_chain_work);
      pCVar15 = pindexLast;
      criticalblock65.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
      criticalblock65.super_unique_lock._M_owns = false;
      std::unique_lock<std::recursive_mutex>::lock(&criticalblock65.super_unique_lock);
      p_Var26 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var26 == (_Base_ptr)0x0) {
LAB_008f143c:
        lVar19 = 0;
      }
      else {
        lVar31 = pfrom->id;
        p_Var21 = &p_Var1->_M_header;
        do {
          if (lVar31 <= (long)*(size_t *)(p_Var26 + 1)) {
            p_Var21 = p_Var26;
          }
          p_Var26 = (&p_Var26->_M_left)[(long)*(size_t *)(p_Var26 + 1) < lVar31];
        } while (p_Var26 != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var21 == p_Var1) goto LAB_008f143c;
        lVar19 = 0;
        if ((long)((_Rb_tree_header *)p_Var21)->_M_node_count <= lVar31) {
          lVar19 = (long)p_Var21 + 0x28;
        }
      }
      bVar12 = CanDirectFetch(this);
      if ((bVar12) && ((pCVar15->nStatus & 6) != 0 && (pCVar15->nStatus & 0x60) == 0)) {
        pCVar18 = ChainstateManager::ActiveChainstate(this->m_chainman);
        iVar13 = base_uint<256U>::CompareTo
                           (&((pCVar18->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish[-1]->nChainWork).
                             super_base_uint<256U>,&(pCVar15->nChainWork).super_base_uint<256U>);
        if (iVar13 < 1) {
          criticalblock64.super_unique_lock._M_device = (mutex_type *)0x0;
          criticalblock64.super_unique_lock._M_owns = false;
          criticalblock64.super_unique_lock._9_7_ = 0;
          local_110 = pCVar15;
          do {
            pCVar18 = ChainstateManager::ActiveChainstate(this->m_chainman);
            iVar13 = local_110->nHeight;
            if (((long)iVar13 < 0) ||
               (ppCVar6 = (pCVar18->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
               (int)((ulong)((long)(pCVar18->m_chain).vChain.
                                   super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6) >> 3)
               <= iVar13)) {
              pCVar16 = (CBlockIndex *)0x0;
            }
            else {
              pCVar16 = ppCVar6[iVar13];
            }
            if (pCVar16 == local_110) break;
            puVar32 = (undefined8 *)criticalblock64.super_unique_lock._8_8_;
            if (0x80 < (ulong)(criticalblock64.super_unique_lock._8_8_ -
                              (long)criticalblock64.super_unique_lock._M_device)) break;
            if ((local_110->nStatus & 8) == 0) {
              puVar8 = local_110->phashBlock;
              if (puVar8 == (uint256 *)0x0) goto LAB_008f1c29;
              criticalblock68.super_unique_lock._M_device =
                   *(mutex_type **)(puVar8->super_base_blob<256U>).m_data._M_elems;
              pbVar10 = &puVar8->super_base_blob<256U>;
              criticalblock68.super_unique_lock._M_owns = (bool)(pbVar10->m_data)._M_elems[8];
              criticalblock68.super_unique_lock._9_1_ = (pbVar10->m_data)._M_elems[9];
              criticalblock68.super_unique_lock._10_1_ = (pbVar10->m_data)._M_elems[10];
              criticalblock68.super_unique_lock._11_1_ = (pbVar10->m_data)._M_elems[0xb];
              criticalblock68.super_unique_lock._12_1_ = (pbVar10->m_data)._M_elems[0xc];
              criticalblock68.super_unique_lock._13_1_ = (pbVar10->m_data)._M_elems[0xd];
              criticalblock68.super_unique_lock._14_1_ = (pbVar10->m_data)._M_elems[0xe];
              criticalblock68.super_unique_lock._15_1_ = (pbVar10->m_data)._M_elems[0xf];
              local_78._0_8_ =
                   *(undefined8 *)((puVar8->super_base_blob<256U>).m_data._M_elems + 0x10);
              local_78._8_8_ =
                   *(undefined8 *)((puVar8->super_base_blob<256U>).m_data._M_elems + 0x18);
              sVar23 = std::
                       multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                       ::count(&this->mapBlocksInFlight,(key_type *)&criticalblock68);
              if ((sVar23 == 0) &&
                 ((iVar13 < (((this->m_chainman->m_options).chainparams)->consensus).SegwitHeight ||
                  (puVar32 = (undefined8 *)criticalblock64.super_unique_lock._8_8_,
                  ((peer->m_their_services)._M_i & NODE_WITNESS) != NODE_NONE)))) {
                if (puVar32 == (undefined8 *)0x0) {
                  std::vector<CBlockIndex_const*,std::allocator<CBlockIndex_const*>>::
                  _M_realloc_insert<CBlockIndex_const*const&>
                            ((vector<CBlockIndex_const*,std::allocator<CBlockIndex_const*>> *)
                             &criticalblock64,(iterator)0x0,&local_110);
                }
                else {
                  *puVar32 = local_110;
                  criticalblock64.super_unique_lock._8_8_ =
                       criticalblock64.super_unique_lock._8_8_ + 8;
                }
              }
            }
            local_110 = local_110->pprev;
          } while (local_110 != (CBlockIndex *)0x0);
          pCVar18 = ChainstateManager::ActiveChainstate(this->m_chainman);
          iVar13 = local_110->nHeight;
          if (((long)iVar13 < 0) ||
             (ppCVar6 = (pCVar18->m_chain).vChain.
                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
             (int)((ulong)((long)(pCVar18->m_chain).vChain.
                                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6) >> 3) <=
             iVar13)) {
            pCVar16 = (CBlockIndex *)0x0;
          }
          else {
            pCVar16 = ppCVar6[iVar13];
          }
          if (pCVar16 == local_110) {
            vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data
            ._M_start = (pointer)0x0;
            vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data
            ._M_finish = (pointer)0x0;
            vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage = (pointer)0x0;
            pmVar11 = criticalblock64.super_unique_lock._M_device;
            pmVar33 = (mutex_type *)criticalblock64.super_unique_lock._8_8_;
            if ((mutex_type *)criticalblock64.super_unique_lock._8_8_ !=
                criticalblock64.super_unique_lock._M_device) {
              do {
                if (0xf < *(ulong *)(lVar19 + 0x58)) break;
                pCVar16 = (CBlockIndex *)
                          pmVar33[-1].super___mutex_base._M_mutex.__data.__list.__next;
                minimum_chain_work.super_base_uint<256U>.pn._0_8_ =
                     CONCAT44(minimum_chain_work.super_base_uint<256U>.pn[1],
                              ((uint)(peer->m_their_services)._M_i & 8) << 0x1b) | 2;
                puVar8 = pCVar16->phashBlock;
                if (puVar8 == (uint256 *)0x0) goto LAB_008f1c29;
                criticalblock68.super_unique_lock._M_device =
                     *(mutex_type **)(puVar8->super_base_blob<256U>).m_data._M_elems;
                pbVar10 = &puVar8->super_base_blob<256U>;
                criticalblock68.super_unique_lock._M_owns = (bool)(pbVar10->m_data)._M_elems[8];
                criticalblock68.super_unique_lock._9_1_ = (pbVar10->m_data)._M_elems[9];
                criticalblock68.super_unique_lock._10_1_ = (pbVar10->m_data)._M_elems[10];
                criticalblock68.super_unique_lock._11_1_ = (pbVar10->m_data)._M_elems[0xb];
                criticalblock68.super_unique_lock._12_1_ = (pbVar10->m_data)._M_elems[0xc];
                criticalblock68.super_unique_lock._13_1_ = (pbVar10->m_data)._M_elems[0xd];
                criticalblock68.super_unique_lock._14_1_ = (pbVar10->m_data)._M_elems[0xe];
                criticalblock68.super_unique_lock._15_1_ = (pbVar10->m_data)._M_elems[0xf];
                local_78._0_8_ =
                     *(undefined8 *)((puVar8->super_base_blob<256U>).m_data._M_elems + 0x10);
                local_78._8_8_ =
                     *(undefined8 *)((puVar8->super_base_blob<256U>).m_data._M_elems + 0x18);
                std::vector<CInv,std::allocator<CInv>>::emplace_back<unsigned_int,uint256>
                          ((vector<CInv,std::allocator<CInv>> *)&vGetData,
                           (uint *)&minimum_chain_work,(uint256 *)&criticalblock68);
                BlockRequested(this,pfrom->id,pCVar16,(iterator **)0x0);
                pLVar20 = LogInstance();
                bVar12 = BCLog::Logger::WillLogCategoryLevel(pLVar20,NET,Debug);
                if (bVar12) {
                  puVar8 = pCVar16->phashBlock;
                  if (puVar8 == (uint256 *)0x0) goto LAB_008f1c29;
                  minimum_chain_work.super_base_uint<256U>.pn._0_8_ =
                       *(undefined8 *)(puVar8->super_base_blob<256U>).m_data._M_elems;
                  minimum_chain_work.super_base_uint<256U>.pn._8_8_ =
                       *(undefined8 *)((puVar8->super_base_blob<256U>).m_data._M_elems + 8);
                  minimum_chain_work.super_base_uint<256U>.pn._16_8_ =
                       *(undefined8 *)((puVar8->super_base_blob<256U>).m_data._M_elems + 0x10);
                  minimum_chain_work.super_base_uint<256U>.pn._24_8_ =
                       *(undefined8 *)((puVar8->super_base_blob<256U>).m_data._M_elems + 0x18);
                  base_blob<256u>::ToString_abi_cxx11_
                            ((string *)&criticalblock68,&minimum_chain_work);
                  local_130 = pfrom->id;
                  source_file_05._M_str =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ;
                  source_file_05._M_len = 0x62;
                  logging_function_05._M_str = "HeadersDirectFetchBlocks";
                  logging_function_05._M_len = 0x18;
                  LogPrintFormatInternal<std::__cxx11::string,long>
                            (logging_function_05,source_file_05,0xb9e,NET,Debug,
                             (ConstevalFormatString<2U>)0xf7cf39,(string *)&criticalblock68,
                             &local_130);
                  if (criticalblock68.super_unique_lock._M_device != (mutex_type *)local_78) {
                    operator_delete(criticalblock68.super_unique_lock._M_device,local_78._0_8_ + 1);
                  }
                }
                pmVar33 = (mutex_type *)((long)&pmVar33[-1].super___mutex_base._M_mutex + 0x20);
              } while (pmVar33 != pmVar11);
              if (1 < (ulong)(((long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 2) *
                             -0x71c71c71c71c71c7)) {
                pLVar20 = LogInstance();
                bVar12 = BCLog::Logger::WillLogCategoryLevel(pLVar20,NET,Debug);
                if (bVar12) {
                  puVar8 = pCVar15->phashBlock;
                  if (puVar8 == (uint256 *)0x0) goto LAB_008f1c29;
                  minimum_chain_work.super_base_uint<256U>.pn._0_8_ =
                       *(undefined8 *)(puVar8->super_base_blob<256U>).m_data._M_elems;
                  minimum_chain_work.super_base_uint<256U>.pn._8_8_ =
                       *(undefined8 *)((puVar8->super_base_blob<256U>).m_data._M_elems + 8);
                  minimum_chain_work.super_base_uint<256U>.pn._16_8_ =
                       *(undefined8 *)((puVar8->super_base_blob<256U>).m_data._M_elems + 0x10);
                  minimum_chain_work.super_base_uint<256U>.pn._24_8_ =
                       *(undefined8 *)((puVar8->super_base_blob<256U>).m_data._M_elems + 0x18);
                  base_blob<256u>::ToString_abi_cxx11_
                            ((string *)&criticalblock68,&minimum_chain_work);
                  source_file_06._M_str =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ;
                  source_file_06._M_len = 0x62;
                  logging_function_06._M_str = "HeadersDirectFetchBlocks";
                  logging_function_06._M_len = 0x18;
                  LogPrintFormatInternal<std::__cxx11::string,int>
                            (logging_function_06,source_file_06,0xba3,NET,Debug,
                             (ConstevalFormatString<2U>)0xf7cf5c,(string *)&criticalblock68,
                             &pCVar15->nHeight);
                  if (criticalblock68.super_unique_lock._M_device != (mutex_type *)local_78) {
                    operator_delete(criticalblock68.super_unique_lock._M_device,local_78._0_8_ + 1);
                  }
                }
              }
            }
            if (vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                super__Vector_impl_data._M_start) {
              if (((((this->m_opts).ignore_incoming_txs == false) &&
                   ((long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                          super__Vector_impl_data._M_start == 0x24)) &&
                  (*(char *)(lVar19 + 0x6a) != '\0')) &&
                 (((this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_node_count == 1
                  && ((pCVar15->pprev->nStatus & 100) == 4)))) {
                CInv::CInv((CInv *)&criticalblock68,4,
                           &(vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                             super__Vector_impl_data._M_start)->hash);
                *(undefined4 *)
                 (((vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                    super__Vector_impl_data._M_start)->hash).super_base_blob<256U>.m_data._M_elems +
                 0x1c) = local_78._16_4_;
                *(undefined8 *)
                 (((vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                    super__Vector_impl_data._M_start)->hash).super_base_blob<256U>.m_data._M_elems +
                 0xc) = local_78._0_8_;
                *(undefined8 *)
                 (((vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                    super__Vector_impl_data._M_start)->hash).super_base_blob<256U>.m_data._M_elems +
                 0x14) = local_78._8_8_;
                *(mutex_type **)
                 vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                 super__Vector_impl_data._M_start = criticalblock68.super_unique_lock._M_device;
                pbVar10 = &((vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                             super__Vector_impl_data._M_start)->hash).super_base_blob<256U>;
                (pbVar10->m_data)._M_elems[4] = criticalblock68.super_unique_lock._M_owns;
                (pbVar10->m_data)._M_elems[5] = criticalblock68.super_unique_lock._9_1_;
                (pbVar10->m_data)._M_elems[6] = criticalblock68.super_unique_lock._10_1_;
                (pbVar10->m_data)._M_elems[7] = criticalblock68.super_unique_lock._11_1_;
                (pbVar10->m_data)._M_elems[8] = criticalblock68.super_unique_lock._12_1_;
                (pbVar10->m_data)._M_elems[9] = criticalblock68.super_unique_lock._13_1_;
                (pbVar10->m_data)._M_elems[10] = criticalblock68.super_unique_lock._14_1_;
                (pbVar10->m_data)._M_elems[0xb] = criticalblock68.super_unique_lock._15_1_;
              }
              criticalblock68.super_unique_lock._M_owns = true;
              criticalblock68.super_unique_lock._9_7_ = 0;
              local_78._0_8_ = 0x61746164746567;
              criticalblock68.super_unique_lock._M_device = (mutex_type *)local_78;
              (anonymous_namespace)::PeerManagerImpl::
              MakeAndPushMessage<std::vector<CInv,std::allocator<CInv>>&>
                        ((PeerManagerImpl *)this->m_connman,pfrom,(string *)&criticalblock68,
                         &vGetData);
              if (criticalblock68.super_unique_lock._M_device != (mutex_type *)local_78) {
                operator_delete(criticalblock68.super_unique_lock._M_device,local_78._0_8_ + 1);
              }
            }
            if (vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              uVar25 = (long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage -
                       (long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                             super__Vector_impl_data._M_start;
              pCVar30 = vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                        super__Vector_impl_data._M_start;
LAB_008f1b11:
              operator_delete(pCVar30,uVar25);
            }
          }
          else {
            pLVar20 = LogInstance();
            bVar12 = BCLog::Logger::WillLogCategoryLevel(pLVar20,NET,Debug);
            if (bVar12) {
              puVar8 = pCVar15->phashBlock;
              if (puVar8 == (uint256 *)0x0) {
LAB_008f1c29:
                __assert_fail("phashBlock != nullptr",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                              ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
              }
              minimum_chain_work.super_base_uint<256U>.pn._0_8_ =
                   *(undefined8 *)(puVar8->super_base_blob<256U>).m_data._M_elems;
              minimum_chain_work.super_base_uint<256U>.pn._8_8_ =
                   *(undefined8 *)((puVar8->super_base_blob<256U>).m_data._M_elems + 8);
              minimum_chain_work.super_base_uint<256U>.pn._16_8_ =
                   *(undefined8 *)((puVar8->super_base_blob<256U>).m_data._M_elems + 0x10);
              minimum_chain_work.super_base_uint<256U>.pn._24_8_ =
                   *(undefined8 *)((puVar8->super_base_blob<256U>).m_data._M_elems + 0x18);
              base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock68,&minimum_chain_work);
              source_file_04._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
              ;
              source_file_04._M_len = 0x62;
              logging_function_04._M_str = "HeadersDirectFetchBlocks";
              logging_function_04._M_len = 0x18;
              LogPrintFormatInternal<std::__cxx11::string,int>
                        (logging_function_04,source_file_04,0xb91,NET,Debug,
                         (ConstevalFormatString<2U>)0xf7cf0d,(string *)&criticalblock68,
                         &pCVar15->nHeight);
              if (criticalblock68.super_unique_lock._M_device != (mutex_type *)local_78) {
                uVar25 = local_78._0_8_ + 1;
                pCVar30 = (pointer)criticalblock68.super_unique_lock._M_device;
                goto LAB_008f1b11;
              }
            }
          }
          if (criticalblock64.super_unique_lock._M_device != (mutex_type *)0x0) {
            operator_delete(criticalblock64.super_unique_lock._M_device,
                            -(long)criticalblock64.super_unique_lock._M_device);
          }
        }
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock65.super_unique_lock);
    }
    else {
      NVar7 = pfrom->id;
      criticalblock68.super_unique_lock._M_device = (mutex_type *)local_78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&criticalblock68,"invalid header received","");
      MaybePunishNodeForBlock(this,NVar7,&state,via_compact_block,(string *)&criticalblock68);
      if (criticalblock68.super_unique_lock._M_device != (mutex_type *)local_78) {
        operator_delete(criticalblock68.super_unique_lock._M_device,local_78._0_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p !=
        &state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2) {
      operator_delete(state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus
                      ._M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2._M_allocated_capacity._1_7_,
                                     state.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p ==
        &state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2)
    goto LAB_008f0b8f;
    uVar27 = state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
             _M_allocated_capacity;
    _Var29._M_p = state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus.
                  _M_p;
  }
  else {
    state.super_ValidationState<BlockValidationResult>._0_8_ =
         &state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length;
    criticalblock68.super_unique_lock._M_device = (mutex_type *)0x21;
    state.super_ValidationState<BlockValidationResult>._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&state,
                    (size_type *)&criticalblock68,0);
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
         (size_type)criticalblock68.super_unique_lock._M_device;
    builtin_strncpy((char *)state.super_ValidationState<BlockValidationResult>._0_8_,
                    "header with invalid proof of work",0x21);
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)criticalblock68.super_unique_lock._M_device;
    *(char *)(state.super_ValidationState<BlockValidationResult>._0_8_ +
             (long)criticalblock68.super_unique_lock._M_device) = '\0';
    Misbehaving((PeerManagerImpl *)peer,(Peer *)&state,message);
LAB_008f0b72:
    if ((size_type *)state.super_ValidationState<BlockValidationResult>._0_8_ ==
        &state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length)
    goto LAB_008f0b8f;
    uVar27 = state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length;
    _Var29._M_p = (pointer)state.super_ValidationState<BlockValidationResult>._0_8_;
  }
  operator_delete(_Var29._M_p,uVar27 + 1);
LAB_008f0b8f:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessHeadersMessage(CNode& pfrom, Peer& peer,
                                            std::vector<CBlockHeader>&& headers,
                                            bool via_compact_block)
{
    size_t nCount = headers.size();

    if (nCount == 0) {
        // Nothing interesting. Stop asking this peers for more headers.
        // If we were in the middle of headers sync, receiving an empty headers
        // message suggests that the peer suddenly has nothing to give us
        // (perhaps it reorged to our chain). Clear download state for this peer.
        LOCK(peer.m_headers_sync_mutex);
        if (peer.m_headers_sync) {
            peer.m_headers_sync.reset(nullptr);
            LOCK(m_headers_presync_mutex);
            m_headers_presync_stats.erase(pfrom.GetId());
        }
        // A headers message with no headers cannot be an announcement, so assume
        // it is a response to our last getheaders request, if there is one.
        peer.m_last_getheaders_timestamp = {};
        return;
    }

    // Before we do any processing, make sure these pass basic sanity checks.
    // We'll rely on headers having valid proof-of-work further down, as an
    // anti-DoS criteria (note: this check is required before passing any
    // headers into HeadersSyncState).
    if (!CheckHeadersPoW(headers, m_chainparams.GetConsensus(), peer)) {
        // Misbehaving() calls are handled within CheckHeadersPoW(), so we can
        // just return. (Note that even if a header is announced via compact
        // block, the header itself should be valid, so this type of error can
        // always be punished.)
        return;
    }

    const CBlockIndex *pindexLast = nullptr;

    // We'll set already_validated_work to true if these headers are
    // successfully processed as part of a low-work headers sync in progress
    // (either in PRESYNC or REDOWNLOAD phase).
    // If true, this will mean that any headers returned to us (ie during
    // REDOWNLOAD) can be validated without further anti-DoS checks.
    bool already_validated_work = false;

    // If we're in the middle of headers sync, let it do its magic.
    bool have_headers_sync = false;
    {
        LOCK(peer.m_headers_sync_mutex);

        already_validated_work = IsContinuationOfLowWorkHeadersSync(peer, pfrom, headers);

        // The headers we passed in may have been:
        // - untouched, perhaps if no headers-sync was in progress, or some
        //   failure occurred
        // - erased, such as if the headers were successfully processed and no
        //   additional headers processing needs to take place (such as if we
        //   are still in PRESYNC)
        // - replaced with headers that are now ready for validation, such as
        //   during the REDOWNLOAD phase of a low-work headers sync.
        // So just check whether we still have headers that we need to process,
        // or not.
        if (headers.empty()) {
            return;
        }

        have_headers_sync = !!peer.m_headers_sync;
    }

    // Do these headers connect to something in our block index?
    const CBlockIndex *chain_start_header{WITH_LOCK(::cs_main, return m_chainman.m_blockman.LookupBlockIndex(headers[0].hashPrevBlock))};
    bool headers_connect_blockindex{chain_start_header != nullptr};

    if (!headers_connect_blockindex) {
        // This could be a BIP 130 block announcement, use
        // special logic for handling headers that don't connect, as this
        // could be benign.
        HandleUnconnectingHeaders(pfrom, peer, headers);
        return;
    }

    // If headers connect, assume that this is in response to any outstanding getheaders
    // request we may have sent, and clear out the time of our last request. Non-connecting
    // headers cannot be a response to a getheaders request.
    peer.m_last_getheaders_timestamp = {};

    // If the headers we received are already in memory and an ancestor of
    // m_best_header or our tip, skip anti-DoS checks. These headers will not
    // use any more memory (and we are not leaking information that could be
    // used to fingerprint us).
    const CBlockIndex *last_received_header{nullptr};
    {
        LOCK(cs_main);
        last_received_header = m_chainman.m_blockman.LookupBlockIndex(headers.back().GetHash());
        if (IsAncestorOfBestHeaderOrTip(last_received_header)) {
            already_validated_work = true;
        }
    }

    // If our peer has NetPermissionFlags::NoBan privileges, then bypass our
    // anti-DoS logic (this saves bandwidth when we connect to a trusted peer
    // on startup).
    if (pfrom.HasPermission(NetPermissionFlags::NoBan)) {
        already_validated_work = true;
    }

    // At this point, the headers connect to something in our block index.
    // Do anti-DoS checks to determine if we should process or store for later
    // processing.
    if (!already_validated_work && TryLowWorkHeadersSync(peer, pfrom,
                chain_start_header, headers)) {
        // If we successfully started a low-work headers sync, then there
        // should be no headers to process any further.
        Assume(headers.empty());
        return;
    }

    // At this point, we have a set of headers with sufficient work on them
    // which can be processed.

    // If we don't have the last header, then this peer will have given us
    // something new (if these headers are valid).
    bool received_new_header{last_received_header == nullptr};

    // Now process all the headers.
    BlockValidationState state;
    if (!m_chainman.ProcessNewBlockHeaders(headers, /*min_pow_checked=*/true, state, &pindexLast)) {
        if (state.IsInvalid()) {
            MaybePunishNodeForBlock(pfrom.GetId(), state, via_compact_block, "invalid header received");
            return;
        }
    }
    assert(pindexLast);

    // Consider fetching more headers if we are not using our headers-sync mechanism.
    if (nCount == m_opts.max_headers_result && !have_headers_sync) {
        // Headers message had its maximum size; the peer may have more headers.
        if (MaybeSendGetHeaders(pfrom, GetLocator(pindexLast), peer)) {
            LogDebug(BCLog::NET, "more getheaders (%d) to end to peer=%d (startheight:%d)\n",
                    pindexLast->nHeight, pfrom.GetId(), peer.m_starting_height);
        }
    }

    UpdatePeerStateForReceivedHeaders(pfrom, peer, *pindexLast, received_new_header, nCount == m_opts.max_headers_result);

    // Consider immediately downloading blocks.
    HeadersDirectFetchBlocks(pfrom, peer, *pindexLast);

    return;
}